

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O2

void __thiscall Heap<int>::HeapifyUp(Heap<int> *this,int index)

{
  int iVar1;
  pointer piVar2;
  int iVar3;
  
  piVar2 = (this->_data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = piVar2[index];
  while( true ) {
    iVar3 = (index + -1) / 2;
    if (iVar1 <= piVar2[iVar3]) break;
    piVar2[index] = piVar2[iVar3];
    piVar2[iVar3] = iVar1;
    index = iVar3;
  }
  return;
}

Assistant:

void Heap<T>::HeapifyUp(int index) {
    while (_data[index] > _data[(index - 1) / 2]) {
        Swap(index, (index - 1) / 2);
        index = (index - 1) / 2;
    }

}